

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O1

void __thiscall
phyr::RenderConfig::addConfigParam<std::__cxx11::string>
          (RenderConfig *this,string *key,
          Param<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param)

{
  pointer psVar1;
  pointer psVar2;
  mapped_type *pmVar3;
  const_iterator cVar4;
  
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,key);
  psVar1 = (pmVar3->argList).
           super__Vector_base<std::shared_ptr<phyr::ParamAbstract>,_std::allocator<std::shared_ptr<phyr::ParamAbstract>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pmVar3->argList).
           super__Vector_base<std::shared_ptr<phyr::ParamAbstract>,_std::allocator<std::shared_ptr<phyr::ParamAbstract>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)SupportedConfigMap_abi_cxx11_,key);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  if ((ulong)(long)(int)((ulong)((long)psVar2 - (long)psVar1) >> 4) <
      (ulong)(*(long *)((long)cVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_true>
                              ._M_cur + 0x30) -
              *(long *)((long)cVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phyr::ParamType,_std::allocator<phyr::ParamType>_>_>,_true>
                              ._M_cur + 0x28) >> 2)) {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phyr::ConfigArgsList>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,key);
    ConfigArgsList::addParam<std::__cxx11::string>(pmVar3,param);
    return;
  }
  return;
}

Assistant:

void addConfigParam(const std::string& key, const Param<U>& param) {
        int idx = configMap[key].getNextExpectedIndex();
        bool shouldAdd = idx < SupportedConfigMap.at(key).size();

        if (shouldAdd) configMap[key].addParam(param);
    }